

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O0

bool iDynTree::checkIfAxesAreIncident(Axis *line_A,Axis *line_B,double tol)

{
  byte bVar1;
  Axis *in_RSI;
  Axis *in_RDI;
  double in_XMM0_Qa;
  RealScalar RVar2;
  RealScalar RVar3;
  double in_stack_00000008;
  Position *in_stack_00000010;
  bool areAxisCoincident;
  Position *in_stack_00000018;
  Axis *in_stack_00000020;
  Axis *in_stack_00000028;
  Direction originDiffDirection;
  bool areOriginCoincident;
  bool arePointCoincident;
  bool areAxesNotParallel;
  Position closest_point_line_B;
  Position closest_point_line_A;
  VectorFixSize<3U> *in_stack_fffffffffffffe28;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe38;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffe90;
  Axis local_b8;
  Axis local_88;
  undefined1 local_51;
  Position local_50 [24];
  Position local_38 [24];
  double local_20;
  bool local_1;
  
  local_20 = in_XMM0_Qa;
  iDynTree::Position::Position(local_38);
  iDynTree::Position::Position(local_50);
  iDynTree::Axis::Axis(&local_88,in_RDI);
  iDynTree::Axis::Axis(&local_b8,in_RSI);
  local_51 = closestPoints(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                           in_stack_00000008);
  if ((bool)local_51) {
    toEigen<3U>(in_stack_fffffffffffffe28);
    toEigen<3U>(in_stack_fffffffffffffe28);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator-
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    RVar2 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)in_RDI);
    local_1 = RVar2 < local_20;
  }
  else {
    iDynTree::Axis::getOrigin();
    toEigen<3U>(in_stack_fffffffffffffe28);
    iDynTree::Axis::getOrigin();
    toEigen<3U>(in_stack_fffffffffffffe28);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
    operator-((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffe38,
              (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffe30);
    RVar3 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)in_RDI);
    if (local_20 <= RVar3) {
      Direction::Direction((Direction *)0x3a42fc);
      iDynTree::Axis::getOrigin();
      toEigen<3U>(in_stack_fffffffffffffe28);
      iDynTree::Axis::getOrigin();
      toEigen<3U>(in_stack_fffffffffffffe28);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
      operator-((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffe38,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffe30);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
      ::normalized(in_stack_fffffffffffffe90);
      toEigen<3U>(in_stack_fffffffffffffe28);
      Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RSI,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI);
      iDynTree::Axis::getDirection();
      bVar1 = iDynTree::Direction::isParallel((Direction *)&stack0xfffffffffffffe90,local_20);
      local_1 = (bool)(bVar1 & 1);
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool checkIfAxesAreIncident(const iDynTree::Axis line_A,
                            const iDynTree::Axis line_B,
                                  double tol=1e-6)
{
    Position closest_point_line_A, closest_point_line_B;
    bool areAxesNotParallel = closestPoints(line_A, line_B, closest_point_line_A, closest_point_line_B);

    if (areAxesNotParallel)
    {
        bool arePointCoincident = ((toEigen(closest_point_line_A)-toEigen(closest_point_line_B)).norm() < tol);

        return arePointCoincident;
    }
    else
    {
        // If the axes are parallel, the axes are incident if they are coincident
        // In particular, they are coincident either if the origin are coincident
        // or if the difference between the origin is parallel as well
        bool areOriginCoincident = ((toEigen(line_A.getOrigin())-toEigen(line_B.getOrigin())).norm() < tol);

        if (areOriginCoincident)
        {
            return true;
        }

        Direction originDiffDirection;
        toEigen(originDiffDirection) = (toEigen(line_A.getOrigin())-toEigen(line_B.getOrigin())).normalized();

        bool areAxisCoincident = originDiffDirection.isParallel(line_A.getDirection(),tol);

        return areAxisCoincident;
    }
}